

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *mat,scalar_sum_op<double> *func)

{
  RhsNested pMVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  Index index;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pMVar1 = mat->m_rhs;
  uVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar2 == 0) {
    __assert_fail("size && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/Redux.h"
                  ,0xca,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Traversal = 3, Unrolling = 0]"
                 );
  }
  uVar6 = uVar2 + 3;
  if (-1 < (long)uVar2) {
    uVar6 = uVar2;
  }
  pdVar3 = (mat->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  if (uVar2 + 1 < 3) {
    pdVar4 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    dVar8 = *pdVar3 * *pdVar4;
    if (1 < (long)uVar2) {
      uVar6 = 1;
      do {
        dVar8 = dVar8 + pdVar3[uVar6] * pdVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  else {
    uVar5 = uVar2 - ((long)uVar2 >> 0x3f) & 0xfffffffffffffffe;
    pdVar4 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    dVar11 = *pdVar3 * *pdVar4;
    dVar8 = pdVar3[1] * pdVar4[1];
    if (3 < (long)uVar2) {
      uVar6 = uVar6 & 0xfffffffffffffffc;
      dVar9 = pdVar3[2] * pdVar4[2];
      dVar10 = pdVar3[3] * pdVar4[3];
      if (7 < (long)uVar2) {
        lVar7 = 4;
        do {
          dVar11 = dVar11 + pdVar3[lVar7] * pdVar4[lVar7];
          dVar8 = dVar8 + (pdVar3 + lVar7)[1] * (pdVar4 + lVar7)[1];
          dVar9 = dVar9 + pdVar3[lVar7 + 2] * pdVar4[lVar7 + 2];
          dVar10 = dVar10 + (pdVar3 + lVar7 + 2)[1] * (pdVar4 + lVar7 + 2)[1];
          lVar7 = lVar7 + 4;
        } while (lVar7 < (long)uVar6);
      }
      dVar11 = dVar9 + dVar11;
      dVar8 = dVar10 + dVar8;
      if ((long)uVar6 < (long)uVar5) {
        dVar11 = dVar11 + pdVar3[uVar6] * pdVar4[uVar6];
        dVar8 = dVar8 + (pdVar3 + uVar6)[1] * (pdVar4 + uVar6)[1];
      }
    }
    dVar8 = dVar8 + dVar11;
    if ((long)uVar5 < (long)uVar2) {
      do {
        dVar8 = dVar8 + pdVar3[uVar5] * pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  return dVar8;
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }